

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileStream.cpp
# Opt level: O0

bool FlatStream_CreateMirror(TBlockStream *pStream)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  void *__s;
  bool bNeedResizeMirrorStream;
  bool bNeedCreateMirrorStream;
  DWORD dwBlockCount;
  DWORD dwBitmapSize;
  LPBYTE FileBitmap;
  ULONGLONG MirrorSize;
  ULONGLONG MasterSize;
  TBlockStream *pStream_local;
  
  MirrorSize = 0;
  bVar2 = true;
  bVar1 = true;
  if (((pStream->super_TFileStream).pMaster == (TFileStream *)0x0) ||
     ((pStream->super_TFileStream).BaseCreate == (STREAM_CREATE)0x0)) {
    pStream_local._7_1_ = false;
  }
  else {
    MasterSize = (ULONGLONG)pStream;
    FileStream_GetSize((pStream->super_TFileStream).pMaster,&MirrorSize);
    iVar3 = (int)(MirrorSize + 0x3fff >> 0xe);
    uVar4 = iVar3 + 7U >> 3;
    *(undefined4 *)(MasterSize + 200) = 0x2ace;
    *(ULONGLONG *)(MasterSize + 0xb8) = MirrorSize;
    *(undefined8 *)(MasterSize + 0xc0) = 0;
    uVar5 = (**(code **)(MasterSize + 0x48))(MasterSize,*(undefined8 *)(MasterSize + 0xb0),0);
    if ((uVar5 & 1) != 0) {
      (**(code **)(MasterSize + 0x68))(MasterSize);
      if (MirrorSize + uVar4 == -0x18) {
        bVar2 = FlatStream_LoadBitmap((TBlockStream *)MasterSize);
        if (bVar2) {
          return true;
        }
        bVar1 = false;
      }
      bVar2 = false;
    }
    if ((bVar2) && (uVar5 = (**(code **)(MasterSize + 0x40))(MasterSize), (uVar5 & 1) == 0)) {
      pStream_local._7_1_ = false;
    }
    else if ((bVar1) && (uVar5 = (**(code **)(MasterSize + 0x60))(MasterSize), (uVar5 & 1) == 0)) {
      pStream_local._7_1_ = false;
    }
    else {
      __s = malloc((ulong)uVar4);
      if (__s == (void *)0x0) {
        pStream_local._7_1_ = false;
      }
      else {
        memset(__s,0,(ulong)uVar4);
        *(void **)(MasterSize + 0xd8) = __s;
        *(uint *)(MasterSize + 0xe8) = uVar4;
        *(undefined4 *)(MasterSize + 0xec) = 0x4000;
        *(int *)(MasterSize + 0xf0) = iVar3;
        *(undefined4 *)(MasterSize + 0xf4) = 0;
        *(undefined4 *)(MasterSize + 0xf8) = 1;
        pStream_local._7_1_ = true;
      }
    }
  }
  return pStream_local._7_1_;
}

Assistant:

static bool FlatStream_CreateMirror(TBlockStream * pStream)
{
    ULONGLONG MasterSize = 0;
    ULONGLONG MirrorSize = 0;
    LPBYTE FileBitmap = NULL;
    DWORD dwBitmapSize;
    DWORD dwBlockCount;
    bool bNeedCreateMirrorStream = true;
    bool bNeedResizeMirrorStream = true;

    // Do we have master function and base creation function?
    if(pStream->pMaster == NULL || pStream->BaseCreate == NULL)
        return false;

    // Retrieve the master file size, block count and bitmap size
    FileStream_GetSize(pStream->pMaster, &MasterSize);
    dwBlockCount = (DWORD)((MasterSize + DEFAULT_BLOCK_SIZE - 1) / DEFAULT_BLOCK_SIZE);
    dwBitmapSize = (DWORD)((dwBlockCount + 7) / 8);

    // Setup stream size and position
    pStream->BuildNumber = DEFAULT_BUILD_NUMBER;        // BUGBUG: Really???
    pStream->StreamSize = MasterSize;
    pStream->StreamPos = 0;

    // Open the base stream for write access
    if(pStream->BaseOpen(pStream, pStream->szFileName, 0))
    {
        // If the file open succeeded, check if the file size matches required size
        pStream->BaseGetSize(pStream, &MirrorSize);
        if(MirrorSize == MasterSize + dwBitmapSize + sizeof(FILE_BITMAP_FOOTER))
        {
            // Attempt to load an existing file bitmap
            if(FlatStream_LoadBitmap(pStream))
                return true;

            // We need to create new file bitmap
            bNeedResizeMirrorStream = false;
        }

        // We need to create mirror stream
        bNeedCreateMirrorStream = false;
    }

    // Create a new stream, if needed
    if(bNeedCreateMirrorStream)
    {
        if(!pStream->BaseCreate(pStream))
            return false;
    }

    // If we need to, then resize the mirror stream
    if(bNeedResizeMirrorStream)
    {
        if(!pStream->BaseResize(pStream, MasterSize + dwBitmapSize + sizeof(FILE_BITMAP_FOOTER)))
            return false;
    }

    // Allocate the bitmap array
    FileBitmap = CASC_ALLOC(BYTE, dwBitmapSize);
    if(FileBitmap == NULL)
        return false;

    // Initialize the bitmap
    memset(FileBitmap, 0, dwBitmapSize);
    pStream->FileBitmap = FileBitmap;
    pStream->BitmapSize = dwBitmapSize;
    pStream->BlockSize  = DEFAULT_BLOCK_SIZE;
    pStream->BlockCount = dwBlockCount;
    pStream->IsComplete = 0;
    pStream->IsModified = 1;

    // Note: Don't write the stream bitmap right away.
    // Doing so would cause sparse file resize on NTFS,
    // which would take long time on larger files.
    return true;
}